

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O1

size_t fiobj_ary_count(FIOBJ ary)

{
  if (((((~(uint)ary & 6) != 0) && (ary != 0)) && ((ary & 1) == 0)) &&
     (*(char *)(ary & 0xfffffffffffffff8) == ')')) {
    return *(long *)(ary + 0x10) - *(long *)(ary + 8);
  }
  __assert_fail("FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0x35,"size_t fiobj_ary_count(const FIOBJ)");
}

Assistant:

FIO_INLINE size_t fiobj_type_is(FIOBJ o, fiobj_type_enum type) {
  switch (type) {
  case FIOBJ_T_NUMBER:
    return (o & FIOBJECT_NUMBER_FLAG) ||
           ((fiobj_type_enum *)o)[0] == FIOBJ_T_NUMBER;
  case FIOBJ_T_NULL:
    return !o || o == fiobj_null();
  case FIOBJ_T_TRUE:
    return o == fiobj_true();
  case FIOBJ_T_FALSE:
    return o == fiobj_false();
  case FIOBJ_T_STRING:
    return (FIOBJECT_STRING_FLAG && (o & FIOBJECT_NUMBER_FLAG) == 0 &&
            (o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_STRING_FLAG) ||
           (FIOBJECT_STRING_FLAG == 0 && FIOBJ_IS_ALLOCATED(o) &&
            ((fiobj_type_enum *)FIOBJ2PTR(o))[0] == FIOBJ_T_STRING);
  case FIOBJ_T_HASH:
    if (FIOBJECT_HASH_FLAG) {
      return ((o & FIOBJECT_NUMBER_FLAG) == 0 &&
              (o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_HASH_FLAG);
    }
  /* fallthrough */
  case FIOBJ_T_FLOAT:
  case FIOBJ_T_ARRAY:
  case FIOBJ_T_DATA:
  case FIOBJ_T_UNKNOWN:
    return FIOBJ_IS_ALLOCATED(o) &&
           ((fiobj_type_enum *)FIOBJ2PTR(o))[0] == type;
  }
  return FIOBJ_IS_ALLOCATED(o) && ((fiobj_type_enum *)FIOBJ2PTR(o))[0] == type;
}